

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_document_initialize
              (yaml_document_t *document,yaml_version_directive_t *version_directive,
              yaml_tag_directive_t *tag_directives_start,yaml_tag_directive_t *tag_directives_end,
              int start_implicit,int end_implicit)

{
  yaml_tag_directive_t *pyVar1;
  yaml_char_t *pyVar2;
  int iVar3;
  size_t sVar4;
  yaml_tag_directive_t value_1;
  yaml_tag_directive_t *tag_directive;
  yaml_mark_t mark;
  yaml_tag_directive_t value;
  anon_struct_24_3_654a3493_conflict tag_directives_copy;
  yaml_version_directive_t *version_directive_copy;
  anon_struct_24_3_654a3493 nodes;
  anon_struct_4_1_a7dec128 context;
  int end_implicit_local;
  int start_implicit_local;
  yaml_tag_directive_t *tag_directives_end_local;
  yaml_tag_directive_t *tag_directives_start_local;
  yaml_version_directive_t *version_directive_local;
  yaml_document_t *document_local;
  
  memset(&version_directive_copy,0,0x18);
  tag_directives_copy.top = (yaml_tag_directive_t *)0x0;
  memset(&value.prefix,0,0x18);
  memset(&mark.column,0,0x10);
  memset(&tag_directive,0,0x18);
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x423,
                  "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                 );
  }
  if (((tag_directives_start == (yaml_tag_directive_t *)0x0) ||
      (tag_directives_end == (yaml_tag_directive_t *)0x0)) &&
     (tag_directives_start != tag_directives_end)) {
    __assert_fail("(tag_directives_start && tag_directives_end) || (tag_directives_start == tag_directives_end)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x425,
                  "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                 );
  }
  version_directive_copy = (yaml_version_directive_t *)yaml_malloc(0x600);
  if ((yaml_node_t *)version_directive_copy == (yaml_node_t *)0x0) {
    nodes.top._4_4_ = 1;
LAB_00230611:
    yaml_free(version_directive_copy);
    nodes.start = (yaml_node_t *)0x0;
    nodes.end = (yaml_node_t *)0x0;
    version_directive_copy = (yaml_version_directive_t *)0x0;
    yaml_free(tag_directives_copy.top);
    while ((yaml_tag_directive_t *)value.prefix != tag_directives_copy.end) {
      pyVar1 = tag_directives_copy.end + -1;
      pyVar2 = tag_directives_copy.end[-1].prefix;
      tag_directives_copy.end = tag_directives_copy.end + -1;
      yaml_free(pyVar1->handle);
      yaml_free(pyVar2);
    }
    yaml_free(value.prefix);
    tag_directives_copy.start = (yaml_tag_directive_t *)0x0;
    tag_directives_copy.end = (yaml_tag_directive_t *)0x0;
    value.prefix = (yaml_char_t *)0x0;
    yaml_free((void *)mark.column);
    yaml_free(value.handle);
    document_local._4_4_ = 0;
  }
  else {
    nodes.start = (yaml_node_t *)((long)version_directive_copy + 0x600);
    nodes.end = (yaml_node_t *)version_directive_copy;
    if (version_directive != (yaml_version_directive_t *)0x0) {
      tag_directives_copy.top = (yaml_tag_directive_t *)yaml_malloc(8);
      if (tag_directives_copy.top == (yaml_tag_directive_t *)0x0) goto LAB_00230611;
      *(int *)&(tag_directives_copy.top)->handle = version_directive->major;
      *(int *)((long)&(tag_directives_copy.top)->handle + 4) = version_directive->minor;
    }
    if (tag_directives_start != tag_directives_end) {
      value.prefix = (yaml_char_t *)yaml_malloc(0x100);
      if ((yaml_tag_directive_t *)value.prefix == (yaml_tag_directive_t *)0x0) {
        nodes.top._4_4_ = 1;
        goto LAB_00230611;
      }
      tag_directives_copy.start = (yaml_tag_directive_t *)((long)value.prefix + 0x100);
      tag_directives_copy.end = (yaml_tag_directive_t *)value.prefix;
      for (value_1.prefix = (yaml_char_t *)tag_directives_start;
          (yaml_tag_directive_t *)value_1.prefix != tag_directives_end;
          value_1.prefix = value_1.prefix + 0x10) {
        if (*(long *)value_1.prefix == 0) {
          __assert_fail("tag_directive->handle",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                        ,0x437,
                        "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                       );
        }
        if (*(long *)(value_1.prefix + 8) == 0) {
          __assert_fail("tag_directive->prefix",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                        ,0x438,
                        "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                       );
        }
        pyVar2 = *(yaml_char_t **)value_1.prefix;
        sVar4 = strlen(*(char **)value_1.prefix);
        iVar3 = yaml_check_utf8(pyVar2,sVar4);
        if (iVar3 == 0) goto LAB_00230611;
        pyVar2 = *(yaml_char_t **)(value_1.prefix + 8);
        sVar4 = strlen(*(char **)(value_1.prefix + 8));
        iVar3 = yaml_check_utf8(pyVar2,sVar4);
        if (iVar3 == 0) goto LAB_00230611;
        mark.column = (size_t)yaml_strdup(*(yaml_char_t **)value_1.prefix);
        value.handle = yaml_strdup(*(yaml_char_t **)(value_1.prefix + 8));
        if ((mark.column == 0) || (value.handle == (yaml_char_t *)0x0)) goto LAB_00230611;
        if ((tag_directives_copy.end == tag_directives_copy.start) &&
           (iVar3 = yaml_stack_extend(&value.prefix,&tag_directives_copy.end,
                                      &tag_directives_copy.start), iVar3 == 0)) {
          nodes.top._4_4_ = 1;
          goto LAB_00230611;
        }
        (tag_directives_copy.end)->handle = (yaml_char_t *)mark.column;
        (tag_directives_copy.end)->prefix = value.handle;
        mark.column = 0;
        value.handle = (yaml_char_t *)0x0;
        tag_directives_copy.end = tag_directives_copy.end + 1;
      }
    }
    memset(document,0,0x68);
    (document->nodes).start = (yaml_node_t *)version_directive_copy;
    (document->nodes).end = nodes.start;
    (document->nodes).top = (yaml_node_t *)version_directive_copy;
    document->version_directive = (yaml_version_directive_t *)tag_directives_copy.top;
    (document->tag_directives).start = (yaml_tag_directive_t *)value.prefix;
    (document->tag_directives).end = tag_directives_copy.end;
    document->start_implicit = start_implicit;
    document->end_implicit = end_implicit;
    (document->start_mark).index = (size_t)tag_directive;
    (document->start_mark).line = mark.index;
    (document->start_mark).column = mark.line;
    (document->end_mark).index = (size_t)tag_directive;
    (document->end_mark).line = mark.index;
    (document->end_mark).column = mark.line;
    document_local._4_4_ = 1;
  }
  return document_local._4_4_;
}

Assistant:

YAML_DECLARE(int)
yaml_document_initialize(yaml_document_t *document,
        yaml_version_directive_t *version_directive,
        yaml_tag_directive_t *tag_directives_start,
        yaml_tag_directive_t *tag_directives_end,
        int start_implicit, int end_implicit)
{
    struct {
        yaml_error_type_t error;
    } context;
    struct {
        yaml_node_t *start;
        yaml_node_t *end;
        yaml_node_t *top;
    } nodes = { NULL, NULL, NULL };
    yaml_version_directive_t *version_directive_copy = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
        yaml_tag_directive_t *top;
    } tag_directives_copy = { NULL, NULL, NULL };
    yaml_tag_directive_t value = { NULL, NULL };
    yaml_mark_t mark = { 0, 0, 0 };

    assert(document);       /* Non-NULL document object is expected. */
    assert((tag_directives_start && tag_directives_end) ||
            (tag_directives_start == tag_directives_end));
                            /* Valid tag directives are expected. */

    if (!STACK_INIT(&context, nodes, yaml_node_t*)) goto error;

    if (version_directive) {
        version_directive_copy = YAML_MALLOC_STATIC(yaml_version_directive_t);
        if (!version_directive_copy) goto error;
        version_directive_copy->major = version_directive->major;
        version_directive_copy->minor = version_directive->minor;
    }

    if (tag_directives_start != tag_directives_end) {
        yaml_tag_directive_t *tag_directive;
        if (!STACK_INIT(&context, tag_directives_copy, yaml_tag_directive_t*))
            goto error;
        for (tag_directive = tag_directives_start;
                tag_directive != tag_directives_end; tag_directive ++) {
            assert(tag_directive->handle);
            assert(tag_directive->prefix);
            if (!yaml_check_utf8(tag_directive->handle,
                        strlen((char *)tag_directive->handle)))
                goto error;
            if (!yaml_check_utf8(tag_directive->prefix,
                        strlen((char *)tag_directive->prefix)))
                goto error;
            value.handle = yaml_strdup(tag_directive->handle);
            value.prefix = yaml_strdup(tag_directive->prefix);
            if (!value.handle || !value.prefix) goto error;
            if (!PUSH(&context, tag_directives_copy, value))
                goto error;
            value.handle = NULL;
            value.prefix = NULL;
        }
    }

    DOCUMENT_INIT(*document, nodes.start, nodes.end, version_directive_copy,
            tag_directives_copy.start, tag_directives_copy.top,
            start_implicit, end_implicit, mark, mark);

    return 1;

error:
    STACK_DEL(&context, nodes);
    yaml_free(version_directive_copy);
    while (!STACK_EMPTY(&context, tag_directives_copy)) {
        yaml_tag_directive_t value = POP(&context, tag_directives_copy);
        yaml_free(value.handle);
        yaml_free(value.prefix);
    }
    STACK_DEL(&context, tag_directives_copy);
    yaml_free(value.handle);
    yaml_free(value.prefix);

    return 0;
}